

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O2

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var10;
  long lVar11;
  uint uVar12;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar4 = *(int *)((long)&pjVar1[3].start_pass + 4);
    if (iVar4 == 0) {
      process_restart(cinfo);
      iVar4 = *(int *)((long)&pjVar1[3].start_pass + 4);
    }
    *(int *)((long)&pjVar1[3].start_pass + 4) = iVar4 + -1;
  }
  if (pjVar1[1].insufficient_data != -1) {
    for (lVar8 = 0; lVar8 < cinfo->blocks_in_MCU; lVar8 = lVar8 + 1) {
      paJVar2 = MCU_data[lVar8];
      lVar11 = (long)cinfo->MCU_membership[lVar8];
      iVar4 = cinfo->cur_comp_info[lVar11]->dc_tbl_no;
      p_Var10 = (&pjVar1[3].decode_mcu)[iVar4] +
                *(int *)((long)&pjVar1[2].decode_mcu + lVar11 * 4 + 4);
      iVar5 = arith_decode(cinfo,(uchar *)p_Var10);
      if (iVar5 == 0) {
        *(undefined4 *)((long)&pjVar1[2].decode_mcu + lVar11 * 4 + 4) = 0;
        uVar12 = *(uint *)(&pjVar1[1].field_0x14 + lVar11 * 4);
      }
      else {
        uVar6 = arith_decode(cinfo,(uchar *)(p_Var10 + 1));
        p_Var10 = p_Var10 + (ulong)uVar6 + 2;
        iVar5 = arith_decode(cinfo,(uchar *)p_Var10);
        uVar12 = 0;
        if (iVar5 != 0) {
          p_Var10 = (&pjVar1[3].decode_mcu)[iVar4] + 0x14;
          uVar12 = 1;
          while (iVar5 = arith_decode(cinfo,(uchar *)p_Var10), iVar5 != 0) {
            uVar12 = uVar12 * 2;
            if (uVar12 == 0x8000) {
              pjVar3 = cinfo->err;
              pjVar3->msg_code = 0x7e;
              (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
              pjVar1[1].insufficient_data = -1;
              return 1;
            }
            p_Var10 = p_Var10 + 1;
          }
        }
        iVar5 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar4] & 0x3f)) >> 1) <= (int)uVar12) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar4] & 0x3f)) >> 1) < (int)uVar12) {
            iVar5 = uVar6 * 4 + 0xc;
          }
          else {
            iVar5 = uVar6 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar1[2].decode_mcu + lVar11 * 4 + 4) = iVar5;
        uVar9 = uVar12;
        while (1 < uVar9) {
          uVar9 = (int)uVar9 >> 1;
          uVar7 = arith_decode(cinfo,(uchar *)(p_Var10 + 0xe));
          if (uVar7 != 0) {
            uVar7 = uVar9;
          }
          uVar12 = uVar12 | uVar7;
        }
        uVar9 = ~uVar12;
        if (uVar6 == 0) {
          uVar9 = uVar12 + 1;
        }
        uVar12 = uVar9 + *(int *)(&pjVar1[1].field_0x14 + lVar11 * 4) & 0xffff;
        *(uint *)(&pjVar1[1].field_0x14 + lVar11 * 4) = uVar12;
      }
      (*paJVar2)[0] = (short)uVar12 << ((byte)cinfo->Al & 0x3f);
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Al = cinfo->Al;
  register int s, r;
  int blkn, ci;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  savable_state state;
  d_derived_tbl *tbl;
  jpeg_component_info *compptr;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
    state = entropy->saved;

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      block = MCU_data[blkn];
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      tbl = entropy->derived_tbls[compptr->dc_tbl_no];

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      HUFF_DECODE(s, br_state, tbl, return FALSE, label1);
      if (s) {
        CHECK_BIT_BUFFER(br_state, s, return FALSE);
        r = GET_BITS(s);
        s = HUFF_EXTEND(r, s);
      }

      /* Convert DC difference to actual value, update last_dc_val */
      if ((state.last_dc_val[ci] >= 0 &&
           s > INT_MAX - state.last_dc_val[ci]) ||
          (state.last_dc_val[ci] < 0 && s < INT_MIN - state.last_dc_val[ci]))
        ERREXIT(cinfo, JERR_BAD_DCT_COEF);
      s += state.last_dc_val[ci];
      state.last_dc_val[ci] = s;
      /* Scale and output the coefficient (assumes jpeg_natural_order[0]=0) */
      (*block)[0] = (JCOEF)LEFT_SHIFT(s, Al);
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    entropy->saved = state;
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}